

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

char * nn_print_line(FILE *out,char *str,size_t width)

{
  size_t sVar1;
  ushort **ppuVar2;
  ulong uVar3;
  
  sVar1 = strlen(str);
  if (0x37 < sVar1) {
    ppuVar2 = __ctype_b_loc();
    for (uVar3 = 0x38; 1 < (uint)uVar3; uVar3 = (ulong)((uint)uVar3 - 1)) {
      if ((*(byte *)((long)*ppuVar2 + (long)str[uVar3] * 2 + 1) & 0x20) != 0) {
        fprintf((FILE *)out,"%.*s",uVar3,str);
        return str + uVar3 + 1;
      }
    }
  }
  fputs(str,(FILE *)out);
  return "";
}

Assistant:

static char *nn_print_line (FILE *out, char *str, size_t width)
{
    int i;
    if (strlen (str) < width) {
        fprintf (out, "%s", str);
        return "";
    }
    for (i = width; i > 1; --i) {
        if (isspace (str[i])) {
            fprintf (out, "%.*s", i, str);
            return str + i + 1;
        }
    }  /* no break points, just print as is */
    fprintf (out, "%s", str);
    return "";
}